

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

void rr::anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               VertexPacket **vertices,size_t numVertices,VertexPacketAllocator *vpalloc)

{
  ProvokingVertex PVar1;
  VertexPacket *pVVar2;
  pointer pLVar3;
  size_type sVar4;
  VertexPacketAllocator *vpalloc_00;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> inputPrimitives;
  allocator_type local_51;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> local_50;
  Program *local_38;
  
  sVar4 = 0;
  if (1 < numVertices) {
    sVar4 = numVertices - 1;
  }
  vpalloc_00 = (VertexPacketAllocator *)numVertices;
  local_38 = program;
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector(&local_50,sVar4,&local_51);
  if (1 < numVertices) {
    PVar1 = state->provokingVertexConvention;
    sVar4 = 0;
    pLVar3 = local_50.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pVVar2 = (vertices + sVar4)[1];
      pLVar3->v0 = vertices[sVar4];
      pLVar3->v1 = pVVar2;
      pLVar3->provokingIndex = (uint)(PVar1 != PROVOKINGVERTEX_FIRST);
      sVar4 = sVar4 + 1;
      pLVar3 = pLVar3 + 1;
    } while (numVertices - 1 != sVar4);
  }
  (anonymous_namespace)::
  makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
            (&local_50,vpalloc);
  (anonymous_namespace)::drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
            (state,renderTarget,local_38,&local_50,vpalloc_00);
  if (local_50.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void drawGeometryShaderOutputAsPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, VertexPacket* const* vertices, size_t numVertices, VertexPacketAllocator& vpalloc)
{
	// Run primitive assembly for generated stream

	const size_t															assemblerPrimitiveCount		= PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::getPrimitiveCount(numVertices);
	std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::BaseType>	inputPrimitives				(assemblerPrimitiveCount);

	PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::exec(inputPrimitives.begin(), vertices, numVertices, state.provokingVertexConvention); // \note input Primitives are baseType_t => only basic primitives (non adjacency) will compile

	// Make shared vertices distinct

	makeSharedVerticesDistinct(inputPrimitives, vpalloc);

	// Draw assembled primitives

	drawBasicPrimitives(state, renderTarget, program, inputPrimitives, vpalloc);
}